

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

Exception syntaxErrorAnalysis(vector<Token,_std::allocator<Token>_> *input)

{
  pointer pTVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  TokenType *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  _Elt_pointer pTVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  pointer pTVar10;
  ulong uVar11;
  TokenType *pTVar12;
  uint uVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  long **pplVar17;
  uint uVar18;
  initializer_list<TokenType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<TokenType> __l_01;
  initializer_list<TokenType> __l_02;
  initializer_list<TokenType> __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  Token token;
  Token prevToken;
  Token nextToken;
  Token tmp;
  stack<Token,_std::deque<Token,_std::allocator<Token>_>_> bracketStack;
  allocator_type local_405;
  uint local_404;
  long **local_400;
  undefined4 local_3f4;
  undefined1 local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  long **local_3c8;
  vector<Token,_std::allocator<Token>_> *local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  Token local_3a8;
  Token local_380;
  undefined1 local_358 [8];
  char *pcStack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  long *local_2b8 [2];
  long local_2a8 [2];
  string local_298;
  long **local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  long local_180;
  ulong local_178;
  vector<TokenType,_std::allocator<TokenType>_> local_170;
  vector<TokenType,_std::allocator<TokenType>_> local_158;
  vector<TokenType,_std::allocator<TokenType>_> local_140;
  vector<TokenType,_std::allocator<TokenType>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  _Deque_base<Token,_std::allocator<Token>_> local_c8;
  vector<Token,_std::allocator<Token>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<Token,_std::allocator<Token>_> local_48;
  
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Token,_std::allocator<Token>_>::_M_initialize_map(&local_c8,0);
  iVar7 = (int)((long)(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x33333333;
  uVar18 = 1;
  if (1 < iVar7) {
    local_178 = (ulong)(iVar7 - 1);
    local_278 = local_338;
    local_180 = (long)(iVar7 + -2);
    local_400 = local_338;
    uVar15 = 0;
    local_3b0 = 0;
    local_3b8 = 0;
    local_3c8 = local_400;
    do {
      pTVar1 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = 1;
      pTVar10 = pTVar1;
      for (uVar11 = uVar15; uVar11 != 0; uVar11 = uVar11 - 1) {
        iVar7 = iVar7 + (uint)(pTVar10->type == EOL);
        pTVar10 = pTVar10 + 1;
      }
      local_3f0._0_4_ = pTVar1[uVar15].type;
      uVar18 = iVar7 - (uint)(local_3f0._0_4_ == EOfF);
      local_3e8._M_dataplus._M_p = local_3f0 + 0x18;
      _Var2._M_p = pTVar1[uVar15].source._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3f0 + 8),_Var2._M_p,
                 _Var2._M_p + pTVar1[uVar15].source._M_string_length);
      std::vector<Token,_std::allocator<Token>_>::vector(&local_78,input);
      iVar7 = (int)uVar15;
      prev(&local_3a8,&local_78,iVar7);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_78);
      std::vector<Token,_std::allocator<Token>_>::vector(&local_48,input);
      next(&local_380,&local_48,iVar7);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_48);
      if (local_3f0._0_4_ == EOL) {
        if (((local_3b0 & 1) != 0) || (bVar5 = false, (local_3b8 & 1) != 0)) {
          local_404 = 0x21;
          goto LAB_0010c35d;
        }
      }
      else {
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_3f0 + 8),"\"");
        if ((iVar8 == 0) && ((local_3b8 & 1) == 0)) {
          local_3b0 = local_3b0 ^ 1;
        }
        else {
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_3f0 + 8),"\'");
          if ((iVar8 != 0) || ((local_3b0 & 1) != 0)) {
            bVar5 = Token::isLeftBracket((Token *)local_3f0);
            if ((bVar5) || (bVar5 = Token::isRightBracket((Token *)local_3f0), bVar5)) {
              bVar5 = Token::isLeftBracket((Token *)local_3f0);
              if (bVar5) {
                bVar5 = false;
                std::deque<Token,_std::allocator<Token>_>::push_back
                          ((deque<Token,_std::allocator<Token>_> *)&local_c8,(value_type *)local_3f0
                          );
                goto LAB_0010c5c8;
              }
              if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
                pTVar9 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  pTVar9 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
                }
                local_358._0_4_ = pTVar9[-1].type;
                pcStack_350 = local_348._M_local_buf + 8;
                pcVar3 = pTVar9[-1].source._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pcStack_350,pcVar3,pcVar3 + pTVar9[-1].source._M_string_length
                          );
                std::deque<Token,_std::allocator<Token>_>::pop_back
                          ((deque<Token,_std::allocator<Token>_> *)&local_c8);
                local_1a8._0_4_ = local_358._0_4_;
                local_1a0._M_p = (pointer)&local_190;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a0,pcStack_350,
                           pcStack_350 +
                           CONCAT44(local_348._M_allocated_capacity._4_4_,
                                    local_348._M_allocated_capacity._0_4_));
                local_1d0._0_4_ = local_3f0._0_4_;
                local_1c8._M_p = (pointer)&local_1b8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1c8,local_3e8._M_dataplus._M_p,
                           local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
                bVar5 = isBracketPair((Token *)local_1a8,(Token *)local_1d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_p != &local_1b8) {
                  operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._M_p != &local_190) {
                  operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
                }
                if (bVar5) {
                  if (pcStack_350 != local_348._M_local_buf + 8) {
                    operator_delete(pcStack_350,local_348._8_8_ + 1);
                  }
                  goto LAB_0010c5c2;
                }
                if (pcStack_350 != local_348._M_local_buf + 8) {
                  operator_delete(pcStack_350,local_348._8_8_ + 1);
                }
              }
              local_404 = 0x20;
            }
            else {
              if (local_3f0._0_4_ == Name) {
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_298,local_3e8._M_dataplus._M_p,
                           local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
                bVar5 = isCorrectName(&local_298);
                if (bVar5) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p != &local_298.field_2) {
                    operator_delete(local_298._M_dataplus._M_p,
                                    local_298.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1f0,local_3e8._M_dataplus._M_p,
                             local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
                  bVar5 = canBeDivided(&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p != &local_298.field_2) {
                    operator_delete(local_298._M_dataplus._M_p,
                                    local_298.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar5) {
                    local_404 = 0x21;
                    if ((*local_3e8._M_dataplus._M_p != '\"') &&
                       (*local_3e8._M_dataplus._M_p != '\'')) {
                      local_404 = 0x1f;
                    }
                    goto LAB_0010c35d;
                  }
                }
              }
              else if ((local_3f0._0_4_ == CharLiteral) && (local_3e8._M_string_length != 3)) {
                local_404 = 0x1c;
                goto LAB_0010c35d;
              }
              iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3f0 + 8),".");
              if (iVar8 == 0) {
                iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_3a8.source,".");
                bVar5 = false;
                if ((iVar8 == 0) ||
                   (iVar8 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_380.source,"."), iVar8 == 0)) goto LAB_0010c5c8;
                if ((local_3a8.type == IntNumber) || (local_380.type != IntNumber)) {
                  iVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_3f0 + 8),".");
                  if ((iVar8 != 0 || iVar7 != 0) &&
                     ((((((local_3a8.type != Keyword &&
                          (bVar5 = Token::isOperator(&local_3a8),
                          !bVar5 && local_3a8.type != Constant)) && (local_380.type != Keyword)) &&
                        (bVar5 = Token::isOperator(&local_380), !bVar5 && local_380.type != Constant
                        )) || (iVar7 = std::__cxx11::
                                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       ::compare(&local_3a8.source,"this"), iVar7 == 0)) &&
                      ((bVar5 = Token::isRightBracket(&local_3a8),
                       bVar5 || local_3a8.type != Punctuation &&
                       (bVar5 = Token::isLeftBracket(&local_380),
                       bVar5 || local_380.type != Punctuation)))))) goto LAB_0010c77f;
                  local_404 = 0x1b;
                }
                else {
                  local_404 = 0x19;
                }
              }
              else {
LAB_0010c77f:
                if ((((uVar15 < 2) || (local_3f0._0_4_ != IntNumber)) ||
                    ((local_180 <= (long)uVar15 ||
                     (((pTVar1 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                 super__Vector_impl_data._M_start,
                       pTVar1[uVar15 - 2].type != IntNumber ||
                       (iVar7 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&pTVar1[uVar15 - 1].source,"."), iVar7 != 0)) ||
                      (iVar7 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               compare(&(input->super__Vector_base<Token,_std::allocator<Token>_>).
                                        _M_impl.super__Vector_impl_data._M_start[uVar15 + 1].source,
                                       "."), iVar7 != 0)))))) ||
                   ((input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar15 + 2].type != IntNumber)) {
                  iVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_3f0 + 8),",");
                  if (iVar7 == 0) {
                    bVar5 = true;
                    if (((uVar15 != 0) &&
                        (bVar6 = Token::isRightBracket(&local_3a8),
                        bVar6 || local_3a8.type != Punctuation)) &&
                       (bVar6 = Token::isLeftBracket(&local_380),
                       bVar6 || local_380.type != Punctuation)) {
                      local_358 = (undefined1  [8])&local_348;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"+","");
                      local_338[0] = local_328;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"-","");
                      __l_00._M_len = 2;
                      __l_00._M_array = (iterator)local_358;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_e0,__l_00,(allocator_type *)&local_405);
                      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_210,local_3a8.source._M_dataplus._M_p,
                                 local_3a8.source._M_dataplus._M_p +
                                 local_3a8.source._M_string_length);
                      bVar6 = contain<std::__cxx11::string>(&local_e0,&local_210);
                      if (bVar6) {
                        local_3f4 = 0;
                      }
                      else {
                        bVar6 = Token::isOperator(&local_3a8);
                        local_3f4 = (undefined4)CONCAT71(extraout_var,bVar6);
                      }
                      local_3c0 = input;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_210._M_dataplus._M_p != &local_210.field_2) {
                        operator_delete(local_210._M_dataplus._M_p,
                                        local_210.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_e0);
                      lVar16 = -0x40;
                      plVar14 = local_328;
                      do {
                        if (plVar14 != (long *)plVar14[-2]) {
                          operator_delete((long *)plVar14[-2],*plVar14 + 1);
                        }
                        plVar14 = plVar14 + -4;
                        lVar16 = lVar16 + 0x20;
                      } while (lVar16 != 0);
                      if ((char)local_3f4 == '\0') {
                        local_358 = (undefined1  [8])&local_348;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"+","");
                        local_338[0] = local_328;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"-","");
                        local_318[0] = local_308;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"!","");
                        __l_04._M_len = 3;
                        __l_04._M_array = (iterator)local_358;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_60,__l_04,(allocator_type *)&local_405);
                        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_230,local_380.source._M_dataplus._M_p,
                                   local_380.source._M_dataplus._M_p +
                                   local_380.source._M_string_length);
                        bVar6 = contain<std::__cxx11::string>(&local_60,&local_230);
                        if (bVar6) {
                          local_3f4 = 0;
                        }
                        else {
                          bVar6 = Token::isOperator(&local_380);
                          local_3f4 = (undefined4)CONCAT71(extraout_var_00,bVar6);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_230._M_dataplus._M_p != &local_230.field_2) {
                          operator_delete(local_230._M_dataplus._M_p,
                                          local_230.field_2._M_allocated_capacity + 1);
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_60);
                        lVar16 = -0x60;
                        plVar14 = local_308;
                        do {
                          if (plVar14 != (long *)plVar14[-2]) {
                            operator_delete((long *)plVar14[-2],*plVar14 + 1);
                          }
                          plVar14 = plVar14 + -4;
                          lVar16 = lVar16 + 0x20;
                        } while (lVar16 != 0);
                        if ((char)local_3f4 == '\0') {
                          local_358 = (undefined1  [8])&local_348;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_358,"this","");
                          input = local_3c0;
                          __l_05._M_len = 1;
                          __l_05._M_array = (iterator)local_358;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector(&local_f8,__l_05,(allocator_type *)&local_405);
                          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_250,local_3a8.source._M_dataplus._M_p,
                                     local_3a8.source._M_dataplus._M_p +
                                     local_3a8.source._M_string_length);
                          bVar5 = contain<std::__cxx11::string>(&local_f8,&local_250);
                          local_3f4 = CONCAT31(local_3f4._1_3_,local_3a8.type != Keyword);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_250._M_dataplus._M_p != &local_250.field_2) {
                            operator_delete(local_250._M_dataplus._M_p,
                                            local_250.field_2._M_allocated_capacity + 1);
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector(&local_f8);
                          if (local_358 != (undefined1  [8])&local_348) {
                            operator_delete((void *)local_358,
                                            CONCAT44(local_348._M_allocated_capacity._4_4_,
                                                     local_348._M_allocated_capacity._0_4_) + 1);
                          }
                          if (bVar5 || (char)local_3f4 != '\0') {
                            local_358 = (undefined1  [8])&local_348;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_358,"this","");
                            local_338[0] = local_328;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_338,"not","");
                            local_318[0] = local_308;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_318,"lambda","");
                            local_2f8[0] = local_2e8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2f8,"new","");
                            local_2d8[0] = local_2c8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2d8,"ref","");
                            local_2b8[0] = local_2a8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2b8,"out","");
                            __l_06._M_len = 6;
                            __l_06._M_array = (iterator)local_358;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector(&local_110,__l_06,(allocator_type *)&local_405);
                            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_270,local_380.source._M_dataplus._M_p,
                                       local_380.source._M_dataplus._M_p +
                                       local_380.source._M_string_length);
                            bVar5 = contain<std::__cxx11::string>(&local_110,&local_270);
                            bVar6 = local_380.type != Keyword;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
                              operator_delete(local_270._M_dataplus._M_p,
                                              local_270.field_2._M_allocated_capacity + 1);
                            }
                            local_3f4 = CONCAT31(local_3f4._1_3_,bVar5 || bVar6);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector(&local_110);
                            lVar16 = -0xc0;
                            plVar14 = local_2a8;
                            do {
                              if (plVar14 != (long *)plVar14[-2]) {
                                operator_delete((long *)plVar14[-2],*plVar14 + 1);
                              }
                              plVar14 = plVar14 + -4;
                              lVar16 = lVar16 + 0x20;
                            } while (lVar16 != 0);
                            input = local_3c0;
                            if ((char)local_3f4 != '\0') goto LAB_0010c80b;
                          }
                          goto LAB_0010d240;
                        }
                      }
                      local_404 = 0x2a;
                      local_400 = (long **)(ulong)uVar18;
                      input = local_3c0;
                      goto LAB_0010c5c8;
                    }
LAB_0010d240:
                    local_404 = 0x2a;
                  }
                  else {
LAB_0010c80b:
                    if (local_3f0._0_4_ == Name) {
                      if (uVar15 == 0) {
LAB_0010caa8:
                        local_358 = (undefined1  [8])0x700000003;
                        pcStack_350 = (char *)0x90000000a;
                        local_348._M_allocated_capacity._0_4_ = 5;
                        __l_01._M_len = 5;
                        __l_01._M_array = (iterator)local_358;
                        std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                  (&local_140,__l_01,&local_405);
                        if (local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start ==
                            local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          bVar5 = false;
                        }
                        else {
                          pTVar4 = local_140.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                          do {
                            pTVar12 = pTVar4 + 1;
                            bVar5 = *pTVar4 ==
                                    (input->super__Vector_base<Token,_std::allocator<Token>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar15 + 1].type;
                            if (bVar5) break;
                            pTVar4 = pTVar12;
                          } while (pTVar12 !=
                                   local_140.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_finish);
                        }
                        if (local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                          operator_delete(local_140.
                                          super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_140.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_140.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (!bVar5) goto LAB_0010cb3e;
                      }
                      else {
                        local_358 = (undefined1  [8])0x700000003;
                        pcStack_350 = (char *)0x90000000a;
                        local_348._M_allocated_capacity._0_4_ = 5;
                        __l._M_len = 5;
                        __l._M_array = (iterator)local_358;
                        std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                  (&local_128,__l,&local_405);
                        if (local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start ==
                            local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          bVar5 = false;
                        }
                        else {
                          pTVar4 = local_128.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                          do {
                            pTVar12 = pTVar4 + 1;
                            bVar5 = *pTVar4 ==
                                    (input->super__Vector_base<Token,_std::allocator<Token>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar15 - 1].type;
                            if (bVar5) break;
                            pTVar4 = pTVar12;
                          } while (pTVar12 !=
                                   local_128.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_finish);
                        }
                        if (local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                          operator_delete(local_128.
                                          super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_128.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_128.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (!bVar5) goto LAB_0010caa8;
                      }
                    }
                    else {
LAB_0010cb3e:
                      if (local_3f0._0_4_ == IntNumber) {
                        if (uVar15 != 0) {
                          local_358 = (undefined1  [8])0xa00000007;
                          pcStack_350 = (char *)0x500000009;
                          __l_02._M_len = 4;
                          __l_02._M_array = (iterator)local_358;
                          std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                    (&local_158,__l_02,&local_405);
                          if (local_158.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                              _M_impl.super__Vector_impl_data._M_start ==
                              local_158.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                            bVar5 = false;
                          }
                          else {
                            pTVar4 = local_158.
                                     super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                            do {
                              pTVar12 = pTVar4 + 1;
                              bVar5 = *pTVar4 ==
                                      (input->super__Vector_base<Token,_std::allocator<Token>_>).
                                      _M_impl.super__Vector_impl_data._M_start[uVar15 - 1].type;
                              if (bVar5) break;
                              pTVar4 = pTVar12;
                            } while (pTVar12 !=
                                     local_158.
                                     super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                     _M_impl.super__Vector_impl_data._M_finish);
                          }
                          if (local_158.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                              _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                            operator_delete(local_158.
                                            super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_158.
                                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_158.
                                                                                                        
                                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (bVar5) goto LAB_0010cc60;
                        }
                        local_358 = (undefined1  [8])0xa00000007;
                        pcStack_350 = (char *)0x500000009;
                        __l_03._M_len = 4;
                        __l_03._M_array = (iterator)local_358;
                        std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                  (&local_170,__l_03,&local_405);
                        if (local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start ==
                            local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          bVar5 = false;
                        }
                        else {
                          pTVar4 = local_170.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                          do {
                            pTVar12 = pTVar4 + 1;
                            bVar5 = *pTVar4 ==
                                    (input->super__Vector_base<Token,_std::allocator<Token>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar15 + 1].type;
                            if (bVar5) break;
                            pTVar4 = pTVar12;
                          } while (pTVar12 !=
                                   local_170.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_finish);
                        }
                        if (local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                          operator_delete(local_170.
                                          super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_170.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_170.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (bVar5) goto LAB_0010cc60;
                      }
                      iVar7 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(local_3f0 + 8),":");
                      if ((iVar7 != 0) ||
                         ((uVar15 != 0 &&
                          (((local_3a8.type == Name && (local_380.type == Name)) ||
                           ((iVar7 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::compare(&local_3a8.source,")"), iVar7 == 0 ||
                            (iVar7 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::compare(&local_380.source,"="), iVar7 == 0)))))))) {
                        bVar5 = false;
                        goto LAB_0010c5c8;
                      }
                    }
LAB_0010cc60:
                    local_404 = 0x1a;
                  }
                }
                else {
                  local_404 = 0x18;
                }
              }
            }
LAB_0010c35d:
            bVar5 = true;
            local_400 = (long **)(ulong)uVar18;
            goto LAB_0010c5c8;
          }
          local_3b8 = local_3b8 ^ 1;
        }
LAB_0010c5c2:
        bVar5 = false;
      }
LAB_0010c5c8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380.source._M_dataplus._M_p != &local_380.source.field_2) {
        operator_delete(local_380.source._M_dataplus._M_p,
                        local_380.source.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.source._M_dataplus._M_p != &local_3a8.source.field_2) {
        operator_delete(local_3a8.source._M_dataplus._M_p,
                        local_3a8.source.field_2._M_allocated_capacity + 1);
      }
      if (local_3e8._M_dataplus._M_p != local_3f0 + 0x18) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      pplVar17 = local_400;
      uVar13 = local_404;
      if (bVar5) goto LAB_0010d274;
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_178);
  }
  uVar13 = 0x20;
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar13 = 0x2b;
  }
  pplVar17 = (long **)0xffffffff;
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pplVar17 = (long **)(ulong)uVar18;
  }
LAB_0010d274:
  std::deque<Token,_std::allocator<Token>_>::~deque
            ((deque<Token,_std::allocator<Token>_> *)&local_c8);
  return (Exception)((ulong)uVar13 | (long)pplVar17 << 0x20);
}

Assistant:

Exception syntaxErrorAnalysis(vector<Token> input) {
	int lineIndex = 1;
	stack<Token> bracketStack;
	bool isString = false, isChar = false;
	// длина входного потока
	int end = input.size();
	// последний символ - EOfF, поэтому читаем до предпоследнего
	for (int i = 0; i < end - 1; ++i) {
		lineIndex = getLineIndex(input, i);
		Token token = input[i];
		Token prevToken = prev(input, i), nextToken = next(input, i);

		if (token.isEndOfLine()) {
			if (isString or isChar) {
				return Exception(QuotesSequenceError, lineIndex);
			}
			continue;
		}
		// обработка строк
		if (token.source == "\"" and not isChar) {
			isString = not isString;
			continue;
		}
		if (token.source == "\'" and not isString) {
			isChar = not isChar;
			continue;
		}
		// обработка скобочных последовательностей
		if (token.isBracket()) {
			if (token.isLeftBracket()) {
				bracketStack.push(token);
			} else {
				if (bracketStack.empty()) {
					return Exception(BracketSequenceError, lineIndex);
				} else {
					Token tmp = bracketStack.top();
					bracketStack.pop();
					if (not isBracketPair(tmp, token))
						return Exception(BracketSequenceError, lineIndex);
				}
			}
			continue;
		}
		// обработка CharFormatError
		if (token.type == CharLiteral and token.source.size() != 3) {
			return Exception(CharFormatError, lineIndex);
		}
		// обработка неправильных имен
		if (token.type == Name and not isCorrectName(token.source) and not canBeDivided(token.source)) {
			if (token.source[0] == '\"' or token.source[0] == '\'') {
				return Exception(QuotesSequenceError, lineIndex);
			}
			return Exception(NameError, lineIndex);
		}
		// MemberError для Int после Name
		// а также UnexpectedDotError - один из операндов точки ключевое слово или оператор и тд
		if (token.source == ".") {
			if (prevToken.source == "." or nextToken.source == ".") continue;
			if (prevToken.type != IntNumber and nextToken.type == IntNumber) {
				return Exception(MemberError, lineIndex);
			}
			if (token.source == "." and i == 0) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (prevToken.type == Keyword or prevToken.isOperator() or prevToken.type == Constant or
			    nextToken.type == Keyword or nextToken.isOperator() or nextToken.type == Constant) {
				if (prevToken.source != "this")
					return Exception(UnexpectedDotError, lineIndex);
			}
			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
		}
		// обработка неправильного использования оператора .  - TooManyPointsInNumber
		if (token.type == IntNumber and i > 1 and i < end - 2) {
			if (input[i - 2].type == IntNumber and input[i - 1].source == "." and
			    input[i + 1].source == "." and input[i + 2].type == IntNumber) {
				return Exception(TooManyPointsInNumber, lineIndex);
			}
		}
		// обработка UnexpectedTokenError
		if (token.source == ",") {
			if (i == 0) return Exception(UnexpectedTokenError, lineIndex);

			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"+", "-"}, prevToken.source) and prevToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"+", "-", "!"}, nextToken.source) and nextToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"this"}, prevToken.source) and prevToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"this", "not", "lambda", "new", "ref", "out"}, nextToken.source) and
			    nextToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
		}

		// SyntaxError
		if (token.type == Name) {
			if (i != 0) {
				if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type))
					return Exception(SyntaxError, lineIndex);
			}
			if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		// TODO: возможны ошибки с Keyword
		if (token.type == IntNumber) {
			if (i != 0) {
				if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type)) {
					return Exception(SyntaxError, lineIndex);
				}
//				if (input[i - 1].type == Keyword and input[i - 1].source != "else") {
//					return Exception(SyntaxError, lineIndex);
//				}
			}
			if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		if (token.source == ":") {
			if (i == 0) return Exception(SyntaxError, lineIndex);
			if ((prevToken.type != Name or nextToken.type != Name) and prevToken.source != ")" and
			    nextToken.source != "=") {
				return Exception(SyntaxError, lineIndex);
			}
		}
	}
	if (not bracketStack.empty()) return Exception(BracketSequenceError, lineIndex);
	return Exception(Nothing);
}